

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O1

critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
* __thiscall
diy::
concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::operator[](concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
             *this,int *x)

{
  mapped_type *pmVar1;
  lock_guard<fast_mutex> l;
  unique_lock<tthread::fast_mutex> local_28;
  
  local_28._M_device = &this->mutex_;
  local_28._M_owns = false;
  std::unique_lock<tthread::fast_mutex>::lock(&local_28);
  local_28._M_owns = true;
  pmVar1 = std::
           map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
           ::operator[](&this->map_,x);
  if ((local_28._M_owns == true) && (local_28._M_device != (fast_mutex *)0x0)) {
    LOCK();
    (local_28._M_device)->mLock = 0;
    UNLOCK();
  }
  return pmVar1;
}

Assistant:

U&              operator[](const T& x)  { lock_guard<fast_mutex> l(mutex_); return map_[x]; }